

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall minibag::PlayerOptions::check(PlayerOptions *this)

{
  size_type sVar1;
  undefined8 uVar2;
  Exception *this_00;
  long in_RDI;
  string *in_stack_ffffffffffffff68;
  Exception *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x88));
  if (sVar1 == 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    miniros::Exception::Exception(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar2,&miniros::Exception::typeinfo,miniros::Exception::~Exception);
  }
  if (((*(byte *)(in_RDI + 0x4c) & 1) != 0) && (*(float *)(in_RDI + 0x50) <= 0.0)) {
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    miniros::Exception::Exception(this_00,in_stack_ffffffffffffff68);
    __cxa_throw(this_00,&miniros::Exception::typeinfo,miniros::Exception::~Exception);
  }
  return;
}

Assistant:

void PlayerOptions::check() {
    if (bags.size() == 0)
        throw Exception("You must specify at least one bag file to play from");
    if (has_duration && duration <= 0.0)
        throw Exception("Invalid duration, must be > 0.0");
}